

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::ForceConstraintPS::ForceConstraintPS
          (ForceConstraintPS *this,ForceConstraintPS *old)

{
  long in_RSI;
  undefined8 *in_RDI;
  PostStep *in_stack_ffffffffffffffa8;
  PostStep *in_stack_ffffffffffffffb0;
  DataArray<bool> *in_stack_ffffffffffffffb8;
  Array<double> *old_00;
  Array<double> *in_stack_ffffffffffffffc0;
  DataArray<bool> *this_00;
  
  PostStep::PostStep(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *in_RDI = &PTR__ForceConstraintPS_004ecdb8;
  *(undefined4 *)(in_RDI + 5) = *(undefined4 *)(in_RSI + 0x28);
  *(undefined4 *)((long)in_RDI + 0x2c) = *(undefined4 *)(in_RSI + 0x2c);
  in_RDI[6] = *(undefined8 *)(in_RSI + 0x30);
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_ffffffffffffffb0,
             (DSVectorBase<double> *)in_stack_ffffffffffffffa8);
  Array<double>::Array(in_stack_ffffffffffffffc0,(Array<double> *)in_stack_ffffffffffffffb8);
  this_00 = (DataArray<bool> *)(in_RDI + 0xe);
  DataArray<bool>::DataArray(this_00,in_stack_ffffffffffffffb8);
  old_00 = (Array<double> *)(in_RDI + 0x11);
  Array<soplex::DSVectorBase<double>_>::Array
            ((Array<soplex::DSVectorBase<double>_> *)this_00,
             (Array<soplex::DSVectorBase<double>_> *)old_00);
  *(byte *)(in_RDI + 0x14) = *(byte *)(in_RSI + 0xa0) & 1;
  *(byte *)((long)in_RDI + 0xa1) = *(byte *)(in_RSI + 0xa1) & 1;
  Array<double>::Array((Array<double> *)this_00,old_00);
  Array<double>::Array((Array<double> *)this_00,old_00);
  in_RDI[0x1b] = *(undefined8 *)(in_RSI + 0xd8);
  in_RDI[0x1c] = *(undefined8 *)(in_RSI + 0xe0);
  in_RDI[0x1d] = *(undefined8 *)(in_RSI + 0xe8);
  return;
}

Assistant:

ForceConstraintPS(const ForceConstraintPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_old_i(old.m_old_i)
         , m_lRhs(old.m_lRhs)
         , m_row(old.m_row)
         , m_objs(old.m_objs)
         , m_fixed(old.m_fixed)
         , m_cols(old.m_cols)
         , m_lhsFixed(old.m_lhsFixed)
         , m_maxSense(old.m_maxSense)
         , m_oldLowers(old.m_oldLowers)
         , m_oldUppers(old.m_oldUppers)
         , m_lhs(old.m_lhs)
         , m_rhs(old.m_rhs)
         , m_rowobj(old.m_rowobj)
      {}